

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteTextures(ColladaExporter *this)

{
  IOSystem *this_00;
  undefined8 texture_00;
  bool bVar1;
  int iVar2;
  IOStream *__p;
  DeadlyImportError *this_01;
  pointer pIVar3;
  char *pcVar4;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f8;
  undefined1 local_5c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  allocator<char> local_581;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_520;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_448 [8];
  string name;
  aiTexture *texture;
  char local_418 [4];
  uint i;
  char str [1024];
  ColladaExporter *this_local;
  
  bVar1 = aiScene::HasTextures(this->mScene);
  if (bVar1) {
    for (texture._4_4_ = 0; texture._4_4_ < this->mScene->mNumTextures;
        texture._4_4_ = texture._4_4_ + 1) {
      name.field_2._8_8_ = this->mScene->mTextures[texture._4_4_];
      if ((aiTexture *)name.field_2._8_8_ != (aiTexture *)0x0) {
        ASSIMP_itoa10(local_418,0x400,texture._4_4_ + 1);
        std::operator+(&local_508,&this->mFile,"_texture_");
        pcVar4 = "";
        if (texture._4_4_ < 1000) {
          pcVar4 = "0";
        }
        std::operator+(&local_4e8,&local_508,pcVar4);
        pcVar4 = "";
        if (texture._4_4_ < 100) {
          pcVar4 = "0";
        }
        std::operator+(&local_4c8,&local_4e8,pcVar4);
        pcVar4 = "";
        if (texture._4_4_ < 10) {
          pcVar4 = "0";
        }
        std::operator+(&local_4a8,&local_4c8,pcVar4);
        std::operator+(&local_488,&local_4a8,local_418);
        std::operator+(&local_468,&local_488,".");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448,&local_468,(char *)(name.field_2._8_8_ + 8));
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_508);
        this_00 = this->mIOSystem;
        iVar2 = (*this_00->_vptr_IOSystem[3])();
        std::operator+(&local_560,&this->mPath,(char)iVar2);
        std::operator+(&local_540,&local_560,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"wb",&local_581);
        __p = IOSystem::Open(this_00,&local_540,&local_580);
        std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
        unique_ptr<std::default_delete<Assimp::IOStream>,void>
                  ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_520,
                   __p);
        std::__cxx11::string::~string((string *)&local_580);
        std::allocator<char>::~allocator(&local_581);
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)&local_560);
        bVar1 = std::operator==(&local_520,(nullptr_t)0x0);
        texture_00 = name.field_2._8_8_;
        if (bVar1) {
          local_5c9 = 1;
          this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::operator+(&local_5c8,"could not open output texture file: ",&this->mPath);
          std::operator+(&local_5a8,&local_5c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_448);
          DeadlyImportError::DeadlyImportError(this_01,&local_5a8);
          local_5c9 = 0;
          __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        if (*(int *)(name.field_2._8_8_ + 4) == 0) {
          pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                   operator->(&local_520);
          (*pIVar3->_vptr_IOStream[3])
                    (pIVar3,*(undefined8 *)(name.field_2._8_8_ + 0x18),
                     (ulong)*(uint *)name.field_2._8_8_,1);
        }
        else {
          pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                             (&local_520);
          Bitmap::Save((aiTexture *)texture_00,pIVar3);
        }
        pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                 operator->(&local_520);
        (*pIVar3->_vptr_IOStream[7])();
        std::make_pair<unsigned_int&,std::__cxx11::string&>
                  (&local_5f8,(uint *)((long)&texture + 4),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448);
        std::
        map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
        ::insert<std::pair<unsigned_int,std::__cxx11::string>>
                  ((map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                    *)&this->textures,&local_5f8);
        std::
        pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_5f8);
        std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                  (&local_520);
        std::__cxx11::string::~string((string *)local_448);
      }
    }
  }
  return;
}

Assistant:

void ColladaExporter::WriteTextures() {
    static const unsigned int buffer_size = 1024;
    char str[buffer_size];

    if (mScene->HasTextures()) {
        for(unsigned int i = 0; i < mScene->mNumTextures; i++) {
            // It would be great to be able to create a directory in portable standard C++, but it's not the case,
            // so we just write the textures in the current directory.

            aiTexture* texture = mScene->mTextures[i];
            if ( nullptr == texture ) {
                continue;
            }

            ASSIMP_itoa10(str, buffer_size, i + 1);

            std::string name = mFile + "_texture_" + (i < 1000 ? "0" : "") + (i < 100 ? "0" : "") + (i < 10 ? "0" : "") + str + "." + ((const char*) texture->achFormatHint);

            std::unique_ptr<IOStream> outfile(mIOSystem->Open(mPath + mIOSystem->getOsSeparator() + name, "wb"));
            if(outfile == NULL) {
                throw DeadlyExportError("could not open output texture file: " + mPath + name);
            }

            if(texture->mHeight == 0) {
                outfile->Write((void*) texture->pcData, texture->mWidth, 1);
            } else {
                Bitmap::Save(texture, outfile.get());
            }

            outfile->Flush();

            textures.insert(std::make_pair(i, name));
        }
    }
}